

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int gost_magma_mgm_cleanup(EVP_CIPHER_CTX *c)

{
  long lVar1;
  
  lVar1 = EVP_CIPHER_CTX_get_cipher_data();
  if (lVar1 != 0) {
    gost_destroy((gost_ctx *)(lVar1 + 0x1c));
    OPENSSL_cleanse((void *)(lVar1 + 0x1090),200);
    EVP_CIPHER_CTX_set_app_data((EVP_CIPHER_CTX *)c,(void *)0x0);
  }
  return (uint)(lVar1 != 0);
}

Assistant:

static int gost_magma_mgm_cleanup(EVP_CIPHER_CTX *c)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(c);
    if (mctx == NULL)
        return 0;
    gost_destroy(&mctx->ks.g_ks.cctx);
    OPENSSL_cleanse(&mctx->mgm, sizeof(mctx->mgm));
    EVP_CIPHER_CTX_set_app_data(c, NULL);
    return 1;
}